

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fgetc(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_context *pCtx_00;
  int iVar1;
  char *pcVar2;
  jx9_int64 jVar3;
  jx9_io_stream *local_58;
  char local_3c [4];
  int n;
  int c;
  io_private *pDev;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pStream = (jx9_io_stream *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting an IO handle");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    _n = (io_private *)jx9_value_to_resource((jx9_value *)pStream->zName);
    pCtx_00 = pjStack_18;
    if ((_n == (io_private *)0x0) || (_n->iMagic != 0xfeac14)) {
      jx9_context_throw_error(pjStack_18,2,"Expecting an IO handle");
      jx9_result_bool(pjStack_18,0);
    }
    else {
      pDev = (io_private *)_n->pStream;
      if ((jx9_io_stream *)pDev == (jx9_io_stream *)0x0) {
        pcVar2 = jx9_function_name(pjStack_18);
        if (pDev == (io_private *)0x0) {
          local_58 = (jx9_io_stream *)0x16ac36;
        }
        else {
          local_58 = pDev->pStream;
        }
        jx9_context_throw_error_format
                  (pCtx_00,2,
                   "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                   ,pcVar2,local_58);
        jx9_result_bool(pjStack_18,0);
      }
      else {
        jVar3 = StreamRead(_n,local_3c,1);
        if ((int)jVar3 < 1) {
          jx9_result_bool(pjStack_18,0);
        }
        else {
          jx9_result_string(pjStack_18,local_3c,1);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_fgetc(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	int c, n;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	n = (int)StreamRead(pDev, (void *)&c, sizeof(char));
	/* IO result */
	if( n < 1 ){
		/* EOF or error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the string holding the character */
		jx9_result_string(pCtx, (const char *)&c, sizeof(char));
	}
	return JX9_OK;	
}